

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O3

size_t __thiscall
trieste::PassDef::apply_special<false,true,true>(PassDef *this,Node *root,Match *match)

{
  TokenDef *pTVar1;
  Node *node;
  element_type *peVar2;
  element_type *peVar3;
  undefined8 *puVar4;
  char cVar5;
  element_type *peVar6;
  __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
  _Var7;
  ptrdiff_t pVar8;
  element_type *peVar9;
  long lVar10;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  element_type *peVar13;
  _Rb_tree_header *p_Var14;
  undefined8 *puVar15;
  bool bVar16;
  iterator it;
  vector<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>
  path;
  iterator start;
  Node root_1;
  size_t local_a8;
  pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
  local_a0;
  PassDef *local_90;
  element_type *local_88;
  iterator iStack_80;
  pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
  *local_78;
  long local_68;
  NodeIt local_60;
  _Base_ptr local_58;
  element_type *local_50;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_48;
  Token local_40;
  element_type *local_38;
  
  std::__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<trieste::NodeDef,void>
            ((__shared_ptr<trieste::NodeDef,(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffb0,
             (__weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)
             (root->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  pTVar1 = (local_50->type_).def;
  if ((pTVar1->fl & 0x40) == 0) {
    p_Var12 = (this->pre_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var14 = &(this->pre_)._M_t._M_impl.super__Rb_tree_header;
    p_Var11 = &p_Var14->_M_header;
    local_90 = this;
    if (p_Var12 == (_Base_ptr)0x0) {
      local_a8 = 0;
    }
    else {
      do {
        if (*(TokenDef **)(p_Var12 + 1) >= pTVar1) {
          p_Var11 = p_Var12;
        }
        p_Var12 = (&p_Var12->_M_left)[*(TokenDef **)(p_Var12 + 1) < pTVar1];
      } while (p_Var12 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var11 == p_Var14) || (pTVar1 < *(TokenDef **)(p_Var11 + 1))) {
        local_a8 = 0;
      }
      else {
        local_88 = local_50;
        iStack_80._M_current =
             (pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
              *)local_48._M_pi;
        if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_48._M_pi)->_M_use_count = (local_48._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_48._M_pi)->_M_use_count = (local_48._M_pi)->_M_use_count + 1;
          }
        }
        if (p_Var11[1]._M_right == (_Base_ptr)0x0) {
          std::__throw_bad_function_call();
        }
        local_a8 = (**(code **)(p_Var11 + 2))(&p_Var11[1]._M_parent);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)iStack_80._M_current !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)iStack_80._M_current);
        }
      }
    }
    local_88 = (element_type *)0x0;
    iStack_80._M_current =
         (pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
          *)0x0;
    local_78 = (pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
                *)0x0;
    local_a0.second._M_current =
         (local_50->children).
         super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_a0.first = (shared_ptr<trieste::NodeDef> *)&stack0xffffffffffffffb0;
    std::
    vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
    ::
    _M_realloc_insert<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>
              ((vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
                *)&local_88,(iterator)0x0,&local_a0);
    if (local_88 != (element_type *)iStack_80._M_current) {
      local_58 = &(local_90->post_)._M_t._M_impl.super__Rb_tree_header._M_header;
      local_38 = (element_type *)p_Var14;
      do {
        node = iStack_80._M_current[-1].first;
        peVar2 = (element_type *)iStack_80._M_current[-1].second._M_current;
        peVar9 = (node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if (peVar2 == (element_type *)
                      (peVar9->children).
                      super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
          lVar10 = *(long *)((long)(local_90->rule_map).map._M_elems +
                            (ulong)(((peVar9->type_).def)->default_map_id & 0xfffffff8));
          if (*(char *)(lVar10 + 0x418) == '\0') {
            local_a0.first =
                 (peVar9->children).
                 super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            if ((element_type *)local_a0.first ==
                (element_type *)
                (((node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                children).
                super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              local_68 = 0;
            }
            else {
              local_68 = 0;
              do {
                puVar15 = *(undefined8 **)
                           (lVar10 + 0x18 +
                           (ulong)(((((((element_type *)local_a0.first)->
                                      super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                                      super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->type_).def)->default_map_id & 0xfffffff8));
                puVar4 = (undefined8 *)puVar15[1];
                local_60._M_current = local_a0.first;
                for (puVar15 = (undefined8 *)*puVar15; puVar15 != puVar4; puVar15 = puVar15 + 0x14)
                {
                  match->index = 0;
                  ((match->captures).
                   super__Vector_base<std::pair<bool,_std::map<trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>_>_>,_std::allocator<std::pair<bool,_std::map<trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->first = false;
                  local_a0.first = local_60._M_current;
                  cVar5 = (**(code **)(*(long *)*puVar15 + 0x20))
                                    ((long *)*puVar15,&local_a0,node,match);
                  if (cVar5 != '\0') {
                    local_40.def = (TokenDef *)local_a0.first;
                    _Var7 = std::
                            __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>,__gnu_cxx::__ops::_Iter_pred<trieste::range_contains_error(__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>)::_lambda(auto:1&)_1_>>
                                      (local_60._M_current);
                    if (((TokenDef *)_Var7._M_current == local_40.def) &&
                       (pVar8 = replace(local_90,match,(Effect<Node> *)(puVar15 + 0x10),&local_60,
                                        (NodeIt *)&local_a0,node), pVar8 != -1)) {
                      local_68 = local_68 + pVar8;
                      if ((local_90->direction_ & 4) == 0) {
                        local_a0.first =
                             (((node->
                               super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr)->children).
                             super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                      }
                      else {
                        local_a0.first =
                             (shared_ptr<trieste::NodeDef> *)
                             ((enable_shared_from_this<trieste::NodeDef> *)
                              &(local_a0.first)->
                               super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> +
                             pVar8);
                      }
                      goto LAB_0018ff85;
                    }
                  }
                }
                local_a0.first = local_60._M_current + 1;
LAB_0018ff85:
              } while ((element_type *)local_a0.first !=
                       (element_type *)
                       (((node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr)->children).
                       super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            }
            peVar9 = (node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
            ;
            lVar10 = local_68;
          }
          else {
            lVar10 = 0;
          }
          local_a8 = lVar10 + local_a8;
          p_Var12 = (local_90->post_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          if (p_Var12 != (_Base_ptr)0x0) {
            pTVar1 = (peVar9->type_).def;
            p_Var11 = local_58;
            do {
              if (*(TokenDef **)(p_Var12 + 1) >= pTVar1) {
                p_Var11 = p_Var12;
              }
              p_Var12 = (&p_Var12->_M_left)[*(TokenDef **)(p_Var12 + 1) < pTVar1];
            } while (p_Var12 != (_Base_ptr)0x0);
            if ((p_Var11 != local_58) && (*(TokenDef **)(p_Var11 + 1) <= pTVar1)) {
              local_a0.second._M_current =
                   (shared_ptr<trieste::NodeDef> *)
                   (node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0.second._M_current !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0.second._M_current)->
                  _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                 local_a0.second._M_current)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0.second._M_current)->
                  _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                 local_a0.second._M_current)->_M_use_count + 1;
                }
              }
              local_a0.first = (shared_ptr<trieste::NodeDef> *)peVar9;
              if (p_Var11[1]._M_right == (_Base_ptr)0x0) {
                std::__throw_bad_function_call();
              }
              lVar10 = (**(code **)(p_Var11 + 2))(&p_Var11[1]._M_parent,&local_a0);
              local_a8 = lVar10 + local_a8;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0.second._M_current !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_a0.second._M_current);
              }
            }
          }
          iStack_80._M_current = iStack_80._M_current + -1;
        }
        else {
          iStack_80._M_current[-1].second._M_current =
               (shared_ptr<trieste::NodeDef> *)&peVar2->type_;
          peVar3 = (peVar2->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                   super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          pTVar1 = (peVar3->type_).def;
          if ((pTVar1->fl & 0x40) == 0) {
            peVar13 = (element_type *)
                      (local_90->pre_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            peVar6 = local_38;
            if (peVar13 != (element_type *)0x0) {
              do {
                bVar16 = (TokenDef *)(peVar13->contents)._M_dataplus._M_p < pTVar1;
                if (!bVar16) {
                  peVar6 = peVar13;
                }
                peVar13 = *(element_type **)((long)&(peVar13->origin_).field_2 + (ulong)bVar16 * 8);
              } while (peVar13 != (element_type *)0x0);
              if ((peVar6 != local_38) &&
                 ((TokenDef *)(peVar6->contents)._M_dataplus._M_p <= pTVar1)) {
                local_a0.second._M_current =
                     (shared_ptr<trieste::NodeDef> *)
                     (peVar2->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                     super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0.second._M_current !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0.second._M_current)->
                    _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                   local_a0.second._M_current)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0.second._M_current)->
                    _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                   local_a0.second._M_current)->_M_use_count + 1;
                  }
                }
                local_a0.first = (shared_ptr<trieste::NodeDef> *)peVar3;
                if (*(long *)((long)&(peVar6->contents).field_2 + 8) == 0) {
                  std::__throw_bad_function_call();
                }
                lVar10 = (*(code *)(peVar6->lines).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start)
                                   (&(peVar6->contents)._M_string_length,&local_a0);
                local_a8 = lVar10 + local_a8;
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0.second._M_current !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_a0.second._M_current);
                }
              }
            }
            local_a0.second._M_current =
                 *(shared_ptr<trieste::NodeDef> **)
                  &(((peVar2->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
                     super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   children).
                   super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                   ._M_impl;
            local_a0.first = (shared_ptr<trieste::NodeDef> *)peVar2;
            if (iStack_80._M_current == local_78) {
              std::
              vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
              ::
              _M_realloc_insert<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>
                        ((vector<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>,std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>>>
                          *)&local_88,iStack_80,&local_a0);
            }
            else {
              (iStack_80._M_current)->first = (shared_ptr<trieste::NodeDef> *)peVar2;
              ((iStack_80._M_current)->second)._M_current = local_a0.second._M_current;
              iStack_80._M_current = iStack_80._M_current + 1;
            }
          }
        }
      } while (local_88 != (element_type *)iStack_80._M_current);
    }
    if (local_88 != (element_type *)0x0) {
      operator_delete(local_88,(long)local_78 - (long)local_88);
    }
  }
  else {
    local_a8 = 0;
  }
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
  }
  return local_a8;
}

Assistant:

size_t apply_special(Node root, Match& match)
    {
      size_t changes = 0;

      auto add = [&](Node& node) SNMALLOC_FAST_PATH_LAMBDA {
        // Don't examine Error or Lift nodes.
        if (node->type() & flag::internal)
          return false;

        if constexpr (Pre)
        {
          auto pre_f = pre_.find(node->type());
          if (pre_f != pre_.end())
            changes += pre_f->second(node);
        }
        if constexpr (Topdown)
          changes += match_children(node, match);

        return true;
      };

      auto remove = [&](Node& node) SNMALLOC_FAST_PATH_LAMBDA {
        if constexpr (!Topdown)
          changes += match_children(node, match);
        else
          snmalloc::UNUSED(node);
        if constexpr (Post)
        {
          auto post_f = post_.find(node->type());
          if (post_f != post_.end())
            changes += post_f->second(node);
        }
      };

      root->traverse(add, remove);

      return changes;
    }